

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

remove_cvref_t<fmt::v11::basic_appender<char>_> __thiscall
fmt::v11::formatter<std::complex<double>,_char,_void>::format<fmt::v11::context>
          (formatter<std::complex<double>,_char,_void> *this,complex<double> *value,context *ctx)

{
  format_args args;
  remove_cvref_t<fmt::v11::basic_appender<char>_&> rVar1;
  context *in_RDX;
  complex<double> *in_RSI;
  basic_appender<char> *in_RDI;
  double dVar2;
  double local_f0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_e8;
  char *local_e0;
  undefined8 local_d8;
  buffer<char> *local_d0 [2];
  complex<double> *local_c0;
  unsigned_long_long in_stack_ffffffffffffff50;
  string_view in_stack_ffffffffffffff60;
  undefined8 local_80;
  undefined1 *local_78;
  char *local_70;
  undefined8 local_68;
  double *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *local_58;
  buffer<char> **local_50;
  char *local_48;
  undefined8 local_40;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_30;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_c0 = in_RSI;
  local_d0[0] = (buffer<char> *)v11::context::out(in_RDX);
  local_e0 = "[{},{}]";
  local_d8 = 7;
  local_e8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
             std::complex<double>::real_abi_cxx11_(local_c0);
  dVar2 = std::complex<double>::imag_abi_cxx11_(local_c0);
  local_48 = local_e0;
  local_40 = local_d8;
  local_50 = local_d0;
  local_58 = &local_e8;
  local_60 = &local_f0;
  local_70 = local_e0;
  local_68 = local_d8;
  local_30.args_ = local_e8.args_;
  local_28 = &stack0xffffffffffffff58;
  local_18 = &stack0xffffffffffffff68;
  local_8 = &local_80;
  local_10 = &stack0xffffffffffffff58;
  local_80 = 0xaa;
  args.field_1.args_ = local_e8.args_;
  args.desc_ = in_stack_ffffffffffffff50;
  local_f0 = dVar2;
  local_78 = local_10;
  rVar1 = vformat_to<fmt::v11::basic_appender<char>_&,_0>(in_RDI,in_stack_ffffffffffffff60,args);
  return (remove_cvref_t<fmt::v11::basic_appender<char>_>)rVar1.container;
}

Assistant:

auto format(const std::complex<double>& value, FormatContext& ctx) const
    {
        // ctx.out() is an output iterator to write to.
        // return format(ctx.out(), "[{},{}]",p.real(), p.imag());
        return fmt::format_to(ctx.out(), "[{},{}]", value.real(), value.imag());
    }